

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,Value *item)

{
  ValueLength *pVVar1;
  CType CVar2;
  ValueLength VVar3;
  bool bVar4;
  uint8_t value;
  long lVar5;
  size_t v;
  Exception *this_00;
  char *pcVar6;
  ExceptionType EVar7;
  int64_t iVar8;
  uint64_t v_00;
  double dVar9;
  undefined1 auVar10 [16];
  
  VVar3 = this->_pos;
  CVar2 = item->_cType;
  checkKeyHasValidType(this,(item->_valueType & ~Null) == UInt);
  switch(item->_valueType) {
  case None:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar6 = "Cannot set a ValueType::None";
    EVar7 = BuilderUnexpectedType;
    goto LAB_00105c30;
  case Illegal:
    value = '\x17';
    goto LAB_001059b1;
  case Null:
    value = '\x18';
    goto LAB_001059b1;
  case Bool:
    if (CVar2 == Bool) {
      value = (item->_value).b + '\x19';
      goto LAB_001059b1;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar6 = "Must give bool for ValueType::Bool";
LAB_00105c2a:
    EVar7 = BuilderUnexpectedValue;
    goto LAB_00105c30;
  case Array:
    bVar4 = Value::unindexed(item);
    addArray(this,bVar4);
    break;
  case Object:
    bVar4 = Value::unindexed(item);
    addObject(this,bVar4);
    break;
  case Double:
    if (CVar2 == UInt64) {
      auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)(item->_value).i);
      auVar10._8_4_ = (int)((ulong)(item->_value).i >> 0x20);
      auVar10._12_4_ = 0x45300000;
      dVar9 = (auVar10._0_8_ - 4503599627370496.0) + (auVar10._8_8_ - 1.9342813113834067e+25);
    }
    else if (CVar2 == Int64) {
      dVar9 = (double)(item->_value).i;
    }
    else {
      if (CVar2 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give number for ValueType::Double";
        goto LAB_00105c2a;
      }
      dVar9 = (double)(item->_value).u;
    }
    reserve(this,9);
    appendByteUnchecked(this,'\x1b');
    appendLengthUnchecked<8ul>(this,(ValueLength)dVar9);
    break;
  case UTCDate:
    if ((CVar2 == UInt64) || (CVar2 == Int64)) {
      iVar8 = (item->_value).i;
    }
    else {
      if (CVar2 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give number for ValueType::UTCDate";
        goto LAB_00105c2a;
      }
      iVar8 = (int64_t)(item->_value).d;
    }
    addUTCDate(this,iVar8);
    break;
  case External:
    if (this->options->disallowExternals != true) {
      if (CVar2 == VoidPtr) {
        reserve(this,9);
        appendByteUnchecked(this,'\x1d');
        *(ValueUnion *)(this->_start + this->_pos) = item->_value;
        this->_pos = this->_pos + 8;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 8;
        break;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar6 = "Must give void pointer for ValueType::External";
      goto LAB_00105c2a;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    EVar7 = BuilderExternalsDisallowed;
    goto LAB_00105ca5;
  case MinKey:
    value = '\x1e';
    goto LAB_001059b1;
  case MaxKey:
    value = '\x1f';
LAB_001059b1:
    appendByte(this,value);
    break;
  case Int:
    if ((CVar2 == UInt64) || (CVar2 == Int64)) {
      iVar8 = (item->_value).i;
    }
    else {
      if (CVar2 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give number for ValueType::Int";
        goto LAB_00105c2a;
      }
      iVar8 = (int64_t)(item->_value).d;
    }
    addInt(this,iVar8);
    break;
  case UInt:
    if (CVar2 == UInt64) {
      v_00 = (item->_value).u;
    }
    else if (CVar2 == Int64) {
      v_00 = (item->_value).u;
      if ((long)v_00 < 0) {
LAB_00105b62:
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give non-negative number for ValueType::UInt";
        goto LAB_00105c2a;
      }
    }
    else {
      if (CVar2 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give number for ValueType::UInt";
        goto LAB_00105c2a;
      }
      dVar9 = (item->_value).d;
      if (dVar9 < 0.0) goto LAB_00105b62;
      v_00 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
    }
    addUInt(this,v_00);
    break;
  case SmallInt:
    if ((CVar2 == UInt64) || (CVar2 == Int64)) {
      lVar5 = (item->_value).i;
    }
    else {
      if (CVar2 != Double) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give number for ValueType::SmallInt";
        goto LAB_00105c2a;
      }
      lVar5 = (long)(item->_value).d;
    }
    if (0xffffffffffffffef < lVar5 - 10U) {
      if (lVar5 < 0) {
        value = (char)lVar5 + '@';
      }
      else {
        value = (char)lVar5 + '0';
      }
      goto LAB_001059b1;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar6 = "Number out of range of ValueType::SmallInt";
    EVar7 = NumberOutOfRange;
    goto LAB_00105c30;
  case String:
    if (CVar2 == StringView) {
      v = ((item->_value).sv)->_M_len;
      pcVar6 = ((item->_value).sv)->_M_str;
    }
    else if (CVar2 == CharPtr) {
      pcVar6 = (item->_value).c;
      v = strlen(pcVar6);
    }
    else {
      if (CVar2 != String) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must give a string or char const* for ValueType::String";
        goto LAB_00105c2a;
      }
      pcVar6 = (((item->_value).s)->_M_dataplus)._M_p;
      v = ((item->_value).s)->_M_string_length;
    }
    if (v < 0x7f) {
      reserve(this,v + 1);
      appendByteUnchecked(this,(char)v + '@');
      if (v == 0) break;
    }
    else {
      reserve(this,v + 9);
      appendByteUnchecked(this,0xbf);
      appendLengthUnchecked<8ul>(this,v);
    }
    goto LAB_00105bca;
  case Binary:
    if (CVar2 == String) {
      pcVar6 = (((item->_value).s)->_M_dataplus)._M_p;
      v = ((item->_value).s)->_M_string_length;
    }
    else if (CVar2 == CharPtr) {
      pcVar6 = (item->_value).c;
      v = strlen(pcVar6);
    }
    else {
      if (CVar2 != StringView) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar6 = "Must provide std::string, std::string_view or char const* for ValueType::Binary";
        goto LAB_00105c2a;
      }
      v = ((item->_value).sv)->_M_len;
      pcVar6 = ((item->_value).sv)->_M_str;
    }
    appendUInt(this,v,0xbf);
    if (v == 0) break;
    reserve(this,v);
LAB_00105bca:
    memcpy(this->_start + this->_pos,pcVar6,v);
    this->_pos = this->_pos + v;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + v;
    break;
  case BCD:
  case Tagged:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    EVar7 = NotImplemented;
LAB_00105ca5:
    Exception::Exception(this_00,EVar7);
    goto LAB_00105c35;
  case Custom:
    bVar4 = this->options->disallowCustom;
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    if (bVar4 == true) {
      EVar7 = BuilderCustomDisallowed;
      goto LAB_00105ca5;
    }
    pcVar6 = "Cannot set a ValueType::Custom with this method";
    EVar7 = BuilderUnexpectedType;
LAB_00105c30:
    Exception::Exception(this_00,EVar7,pcVar6);
LAB_00105c35:
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return this->_start + VVar3;
}

Assistant:

uint8_t* Builder::set(Value const& item) {
  auto const oldPos = _pos;
  auto ctype = item.cType();

  checkKeyHasValidType(item.valueType() == ValueType::String ||
                       item.valueType() == ValueType::UInt);

  // This method builds a single further VPack item at the current
  // append position. If this is an array or object, then an index
  // table is created and a new ValueLength is pushed onto the stack.
  switch (item.valueType()) {
    case ValueType::Null: {
      appendByte(0x18);
      break;
    }
    case ValueType::Bool: {
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::Bool)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must give bool for ValueType::Bool");
      }
      appendByte(item.getBool() ? 0x1a : 0x19);
      break;
    }
    case ValueType::Double: {
      static_assert(sizeof(double) == sizeof(uint64_t),
                    "size of double is not 8 bytes");
      double v = 0.0;
      uint64_t x;
      switch (ctype) {
        case Value::CType::Double:
          v = item.getDouble();
          break;
        case Value::CType::Int64:
          v = static_cast<double>(item.getInt64());
          break;
        case Value::CType::UInt64:
          v = static_cast<double>(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::Double");
      }
      reserve(1 + sizeof(double));
      appendByteUnchecked(0x1b);
      std::memcpy(&x, &v, sizeof(double));
      appendLengthUnchecked<sizeof(double)>(x);
      break;
    }
    case ValueType::SmallInt: {
      int64_t vv = 0;
      switch (ctype) {
        case Value::CType::Double:
          vv = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          vv = item.getInt64();
          break;
        case Value::CType::UInt64:
          vv = static_cast<int64_t>(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::SmallInt");
      }
      if (VELOCYPACK_UNLIKELY(vv < -6 || vv > 9)) {
        throw Exception(Exception::NumberOutOfRange,
                        "Number out of range of ValueType::SmallInt");
      }
      if (vv >= 0) {
        appendByte(static_cast<uint8_t>(vv + 0x30));
      } else {
        appendByte(static_cast<uint8_t>(vv + 0x40));
      }
      break;
    }
    case ValueType::Int: {
      int64_t v;
      switch (ctype) {
        case Value::CType::Double:
          v = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          v = item.getInt64();
          break;
        case Value::CType::UInt64:
          v = toInt64(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::Int");
      }
      addInt(v);
      break;
    }
    case ValueType::UInt: {
      uint64_t v = 0;
      switch (ctype) {
        case Value::CType::Double:
          if (VELOCYPACK_UNLIKELY(item.getDouble() < 0.0)) {
            throw Exception(
                Exception::BuilderUnexpectedValue,
                "Must give non-negative number for ValueType::UInt");
          }
          v = static_cast<uint64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          if (VELOCYPACK_UNLIKELY(item.getInt64() < 0)) {
            throw Exception(
                Exception::BuilderUnexpectedValue,
                "Must give non-negative number for ValueType::UInt");
          }
          v = static_cast<uint64_t>(item.getInt64());
          break;
        case Value::CType::UInt64:
          v = item.getUInt64();
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::UInt");
      }
      addUInt(v);
      break;
    }
    case ValueType::String: {
      char const* p;
      std::size_t size;
      if (ctype == Value::CType::String) {
        std::string const* s = item.getString();
        size = s->size();
        p = s->data();
      } else if (ctype == Value::CType::CharPtr) {
        p = item.getCharPtr();
        size = strlen(p);
      } else if (ctype == Value::CType::StringView) {
        std::string_view const* sv = item.getStringView();
        size = sv->size();
        p = sv->data();
      } else {
        throw Exception(
            Exception::BuilderUnexpectedValue,
            "Must give a string or char const* for ValueType::String");
      }
      if (size <= 126) {
        // short string
        reserve(1 + size);
        appendByteUnchecked(static_cast<uint8_t>(0x40 + size));
      } else {
        // long string
        reserve(1 + 8 + size);
        appendByteUnchecked(0xbf);
        appendLengthUnchecked<8>(size);
      }
      if (size != 0) {
        VELOCYPACK_ASSERT(p != nullptr);
        std::memcpy(_start + _pos, p, size);
        advance(size);
      }
      break;
    }
    case ValueType::Array: {
      addArray(item.unindexed());
      break;
    }
    case ValueType::Object: {
      addObject(item.unindexed());
      break;
    }
    case ValueType::UTCDate: {
      int64_t v;
      switch (ctype) {
        case Value::CType::Double:
          v = static_cast<int64_t>(item.getDouble());
          break;
        case Value::CType::Int64:
          v = item.getInt64();
          break;
        case Value::CType::UInt64:
          v = toInt64(item.getUInt64());
          break;
        default:
          throw Exception(Exception::BuilderUnexpectedValue,
                          "Must give number for ValueType::UTCDate");
      }
      addUTCDate(v);
      break;
    }
    case ValueType::Binary: {
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::String &&
                              ctype != Value::CType::CharPtr &&
                              ctype != Value::CType::StringView)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must provide std::string, std::string_view or char "
                        "const* for ValueType::Binary");
      }
      char const* p;
      ValueLength size;
      if (ctype == Value::CType::String) {
        p = item.getString()->data();
        size = item.getString()->size();
      } else if (ctype == Value::CType::StringView) {
        p = item.getStringView()->data();
        size = item.getStringView()->size();
      } else {
        p = item.getCharPtr();
        size = strlen(p);
      }
      appendUInt(size, 0xbf);
      if (size != 0) {
        reserve(size);
        VELOCYPACK_ASSERT(p != nullptr);
        std::memcpy(_start + _pos, p, checkOverflow(size));
        advance(size);
      }
      break;
    }
    case ValueType::External: {
      if (options->disallowExternals) {
        // External values explicitly disallowed as a security
        // precaution
        throw Exception(Exception::BuilderExternalsDisallowed);
      }
      if (VELOCYPACK_UNLIKELY(ctype != Value::CType::VoidPtr)) {
        throw Exception(Exception::BuilderUnexpectedValue,
                        "Must give void pointer for ValueType::External");
      }
      reserve(1 + sizeof(void*));
      // store pointer. this doesn't need to be portable
      appendByteUnchecked(0x1d);
      void const* value = item.getExternal();
      std::memcpy(_start + _pos, &value, sizeof(void*));
      advance(sizeof(void*));
      break;
    }
    case ValueType::Illegal: {
      appendByte(0x17);
      break;
    }
    case ValueType::MinKey: {
      appendByte(0x1e);
      break;
    }
    case ValueType::MaxKey: {
      appendByte(0x1f);
      break;
    }
    case ValueType::BCD: {
      throw Exception(Exception::NotImplemented);
    }
    case ValueType::Tagged: {
      throw Exception(Exception::NotImplemented);
    }
    case ValueType::Custom: {
      if (options->disallowCustom) {
        // Custom values explicitly disallowed as a security precaution
        throw Exception(Exception::BuilderCustomDisallowed);
      }
      throw Exception(Exception::BuilderUnexpectedType,
                      "Cannot set a ValueType::Custom with this method");
    }
    case ValueType::None: {
      throw Exception(Exception::BuilderUnexpectedType,
                      "Cannot set a ValueType::None");
    }
  }
  return _start + oldPos;
}